

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

void __thiscall
t_js_generator::parse_imports(t_js_generator *this,t_program *program,string *imports_string)

{
  reference pbVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  istream *piVar5;
  ulong uVar6;
  char *pcVar7;
  invalid_argument *piVar8;
  runtime_error *prVar9;
  pointer ppVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_6a8;
  undefined1 local_6a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_698;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  undefined1 local_648 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> module_import_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  undefined1 local_5d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined1 local_598 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> import_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> module_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  long local_4d0;
  size_type separator_position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  undefined1 local_460 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> episode_file_path;
  string line;
  ifstream episode_file;
  string local_218 [32];
  reference local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *import_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string import;
  stringstream sstream;
  string *imports_string_local;
  t_program *program_local;
  t_js_generator *this_local;
  
  bVar2 = t_program::get_recursive(program);
  if (bVar2) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar8,"[-gen js:imports=] option is not usable in recursive code generation mode");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  _Var4 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(import.field_2._M_local_buf + 8),(string *)imports_string,_Var4);
  std::__cxx11::string::string((string *)&__range1);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(import.field_2._M_local_buf + 8),(string *)&__range1,':');
    bVar2 = std::ios::operator_cast_to_bool(piVar5 + *(long *)(*(long *)piVar5 + -0x18));
    if (!bVar2) break;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->imports,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->imports);
  if (bVar2) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar8,
               "invalid usage: [-gen js:imports=] requires at least one path (multiple paths are separated by \':\')"
              );
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->imports);
  import_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->imports);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&import_1);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::stringstream::~stringstream((stringstream *)(import.field_2._M_local_buf + 8));
      return;
    }
    local_1f8 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    uVar6 = std::__cxx11::string::empty();
    pbVar1 = local_1f8;
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pbVar1);
      pbVar1 = local_1f8;
      if (*pcVar7 == '/') {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_218,(ulong)pbVar1);
        std::__cxx11::string::operator=((string *)local_1f8,local_218);
        std::__cxx11::string::~string(local_218);
      }
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar8,"empty paths are not allowed in imports");
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::ifstream::ifstream((void *)((long)&line.field_2 + 8));
    std::__cxx11::string::string((string *)(episode_file_path.field_2._M_local_buf + 8));
    std::operator+(&local_480,local_1f8,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                   &local_480,&episode_file_name_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_480);
    std::ifstream::open((string *)(line.field_2._M_local_buf + 8),(_Ios_Openmode)local_460);
    bVar3 = std::ios::operator!((void *)((long)&line.field_2 +
                                        *(long *)(line.field_2._8_8_ + -0x18) + 8));
    if ((bVar3 & 1) != 0) {
      separator_position._7_1_ = 1;
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_4c0,"failed to open the file \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460)
      ;
      std::operator+(&local_4a0,&local_4c0,"\'");
      std::runtime_error::runtime_error(prVar9,(string *)&local_4a0);
      separator_position._7_1_ = 0;
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),
                          (string *)(episode_file_path.field_2._M_local_buf + 8));
      bVar2 = std::ios::operator_cast_to_bool(piVar5 + *(long *)(*(long *)piVar5 + -0x18));
      if (!bVar2) break;
      local_4d0 = std::__cxx11::string::find((char)&episode_file_path + '\x18',0x3a);
      if (local_4d0 == -1) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_550,"the episode file \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460);
        std::operator+(&local_530,&local_550,"\' is malformed, the line \'");
        std::operator+(&local_510,&local_530,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&episode_file_path.field_2 + 8));
        std::operator+(&local_4f0,&local_510,"\' does not have a key:value separator \':\'");
        std::runtime_error::runtime_error(prVar9,(string *)&local_4f0);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::substr
                ((ulong)((long)&import_path.field_2 + 8),
                 (ulong)((long)&episode_file_path.field_2 + 8));
      std::__cxx11::string::substr((ulong)local_598,(ulong)((long)&episode_file_path.field_2 + 8));
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        local_5d9 = 1;
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_5d8,"the episode file \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460);
        std::operator+(&local_5b8,&local_5d8,"\' is malformed, the module name is empty");
        std::runtime_error::runtime_error(prVar9,(string *)&local_5b8);
        local_5d9 = 0;
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar6 = std::__cxx11::string::empty();
      pbVar1 = local_1f8;
      if ((uVar6 & 1) != 0) {
        module_import_path.field_2._M_local_buf[0xf] = '\x01';
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_620,"the episode file \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460);
        std::operator+(&local_600,&local_620,"\' is malformed, the import path is empty");
        std::runtime_error::runtime_error(prVar9,(string *)&local_600);
        module_import_path.field_2._M_local_buf[0xf] = '\0';
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::find_last_of((char)local_1f8,0x2f);
      std::__cxx11::string::substr((ulong)&result.second,(ulong)pbVar1);
      std::operator+(&local_668,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &result.second,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_648,
                     &local_668,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598)
      ;
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&result.second);
      pVar11 = std::
               unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
                         ((unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&this->module_name_2_import_path,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&import_path.field_2 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_648);
      local_6a8._M_cur =
           (__node_type *)
           pVar11.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
           ._M_cur;
      local_6a0 = pVar11.second;
      local_698._M_cur = local_6a8._M_cur;
      result.first.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._0_1_ = local_6a0;
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_748,"multiple providers of import path found for ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&import_path.field_2 + 8));
        std::operator+(&local_728,&local_748,"\n\t");
        std::operator+(&local_708,&local_728,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_648);
        std::operator+(&local_6e8,&local_708,"\n\t");
        ppVar10 = std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                  ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                *)&local_698);
        std::operator+(&local_6c8,&local_6e8,&ppVar10->second);
        std::runtime_error::runtime_error(prVar9,(string *)&local_6c8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::~string((string *)local_648);
      std::__cxx11::string::~string((string *)local_598);
      std::__cxx11::string::~string((string *)(import_path.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_460);
    std::__cxx11::string::~string((string *)(episode_file_path.field_2._M_local_buf + 8));
    std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void t_js_generator::parse_imports(t_program* program, const std::string& imports_string) {
  if (program->get_recursive()) {
    throw std::invalid_argument("[-gen js:imports=] option is not usable in recursive code generation mode");
  }
  std::stringstream sstream(imports_string);
  std::string import;
  while (std::getline(sstream, import, ':')) {
    imports.emplace_back(import);
  }
  if (imports.empty()) {
    throw std::invalid_argument("invalid usage: [-gen js:imports=] requires at least one path "
          "(multiple paths are separated by ':')");
  }
  for (auto& import : imports) {
    // Strip trailing '/'
    if (!import.empty() && import[import.size() - 1] == '/') {
      import = import.substr(0, import.size() - 1);
    }
    if (import.empty()) {
      throw std::invalid_argument("empty paths are not allowed in imports");
    }
    std::ifstream episode_file;
    string line;
    const auto episode_file_path = import + "/" + episode_file_name;
    episode_file.open(episode_file_path);
    if (!episode_file) {
      throw std::runtime_error("failed to open the file '" + episode_file_path + "'");
    }
    while (std::getline(episode_file, line)) {
      const auto separator_position = line.find(':');
      if (separator_position == string::npos) {
        // could not find the separator in the line
        throw std::runtime_error("the episode file '" + episode_file_path + "' is malformed, the line '" + line
          + "' does not have a key:value separator ':'");
      }
      const auto module_name = line.substr(0, separator_position);
      const auto import_path = line.substr(separator_position + 1);
      if (module_name.empty()) {
        throw std::runtime_error("the episode file '" + episode_file_path + "' is malformed, the module name is empty");
      }
      if (import_path.empty()) {
        throw std::runtime_error("the episode file '" + episode_file_path + "' is malformed, the import path is empty");
      }
      const auto module_import_path = import.substr(import.find_last_of('/') + 1) + "/" + import_path;
      const auto result = module_name_2_import_path.emplace(module_name, module_import_path);
      if (!result.second) {
        throw std::runtime_error("multiple providers of import path found for " + module_name
          + "\n\t" + module_import_path + "\n\t" + result.first->second);
      }
    }
  }
}